

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

int __thiscall
embree::SceneGraph::PointSetNode::verify
          (PointSetNode *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  runtime_error *prVar4;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *n;
  const_iterator __end2;
  const_iterator __begin2;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *__range2;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *p;
  const_iterator __end1;
  const_iterator __begin1;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *__range1;
  size_t N;
  PointSetNode *in_stack_ffffffffffffff68;
  __normal_iterator<const_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
  *in_stack_ffffffffffffff70;
  __normal_iterator<const_embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
  local_60;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *local_58;
  reference local_40;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *local_38;
  __normal_iterator<const_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
  local_30;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_28;
  size_t local_20;
  PointSetNode *local_18;
  reference local_10;
  reference local_8;
  undefined7 extraout_var;
  
  local_18 = this;
  local_20 = numVertices(in_stack_ffffffffffffff68);
  local_28 = &this->positions;
  local_30._M_current =
       (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
       std::
       vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
       ::begin((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                *)in_stack_ffffffffffffff68);
  local_38 = (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
             std::
             vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             ::end((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    *)in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff70,
                       (__normal_iterator<const_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) {
      if (this->type == RTC_GEOMETRY_TYPE_ORIENTED_DISC_POINT) {
        sVar3 = std::
                vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ::size(&this->normals);
        if (sVar3 == 0) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar4,"normal array required for oriented disc");
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_58 = &this->normals;
        local_60._M_current =
             (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
             std::
             vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ::begin((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      *)in_stack_ffffffffffffff68);
        std::
        vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
        ::end((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               *)in_stack_ffffffffffffff68);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                              *)in_stack_ffffffffffffff70,
                             (__normal_iterator<const_embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                              *)in_stack_ffffffffffffff68);
          iVar2 = (int)CONCAT71(extraout_var,bVar1);
          if (!bVar1) break;
          local_10 = __gnu_cxx::
                     __normal_iterator<const_embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                     ::operator*(&local_60);
          if (local_10->size_active != local_20) {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar4,"incompatible normal array size");
            __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          __gnu_cxx::
          __normal_iterator<const_embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
          ::operator++(&local_60);
        }
      }
      else {
        sVar3 = std::
                vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ::size(&this->normals);
        if (sVar3 != 0) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar4,"normal array not supported for this geometry type");
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar2 = 0;
      }
      return iVar2;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<const_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
               ::operator*(&local_30);
    local_8 = local_40;
    if (local_40->size_active != local_20) break;
    __gnu_cxx::
    __normal_iterator<const_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>_>
    ::operator++(&local_30);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,"incompatible vertex array sizes");
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SceneGraph::PointSetNode::verify() const
  {
    const size_t N = numVertices();

    for (const auto& p : positions)
      if (p.size() != N)
        THROW_RUNTIME_ERROR("incompatible vertex array sizes");

    if (type == RTC_GEOMETRY_TYPE_ORIENTED_DISC_POINT)
    {
      if (!normals.size())
        THROW_RUNTIME_ERROR("normal array required for oriented disc");

      for (const auto& n : normals)
        if (n.size() != N)
          THROW_RUNTIME_ERROR("incompatible normal array size");
    }
    else
    {
      if (normals.size())
        THROW_RUNTIME_ERROR("normal array not supported for this geometry type");
    }
  }